

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O2

void __thiscall Date::add_year(Date *this,int n)

{
  bool bVar1;
  undefined8 extraout_RAX;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  if (0 < n) {
    if (this->m == feb) {
      iVar2 = this->y;
      if (this->d == 0x1d) {
        bVar1 = is_leap(iVar2 + n);
        if (!bVar1) {
          this->m = mar;
          this->d = 1;
        }
      }
    }
    else {
      iVar2 = this->y;
    }
    this->y = iVar2 + n;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"add_year() - negative argument passed",&local_39);
  error(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Date::add_year(int n)
{
	if (n <= 0)
		error("add_year() - negative argument passed");
	if (m == Month::feb && d == 29 && !is_leap(y + n))
	{
		m = Month::mar;
		d = 1;
	}
	y += n;
}